

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# summary.cpp
# Opt level: O2

OperatorResultType
duckdb::SummaryFunction
          (ExecutionContext *context,TableFunctionInput *data_p,DataChunk *input,DataChunk *output)

{
  reference this;
  reference other;
  ulong uVar1;
  ulong index;
  string summary_val;
  string local_b0;
  string local_90;
  Value local_70;
  
  uVar1 = input->count;
  output->count = uVar1;
  for (index = 0; index < uVar1; index = index + 1) {
    ::std::__cxx11::string::string((string *)&summary_val,"[",(allocator *)&local_70);
    for (uVar1 = 0;
        uVar1 < (ulong)(((long)(input->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)(input->data).
                              super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x68); uVar1 = uVar1 + 1)
    {
      DataChunk::GetValue(&local_70,input,uVar1,index);
      Value::ToString_abi_cxx11_(&local_90,&local_70);
      ::std::__cxx11::string::append((string *)&summary_val);
      ::std::__cxx11::string::~string((string *)&local_90);
      Value::~Value(&local_70);
      if (uVar1 < ((long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                         .super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                         _M_impl.super__Vector_impl_data._M_finish -
                  (long)(input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                        super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
                        super__Vector_impl_data._M_start) / 0x68 - 1U) {
        ::std::__cxx11::string::append((char *)&summary_val);
      }
    }
    ::std::__cxx11::string::append((char *)&summary_val);
    ::std::__cxx11::string::string((string *)&local_b0,(string *)&summary_val);
    Value::Value(&local_70,&local_b0);
    DataChunk::SetValue(output,0,index,&local_70);
    Value::~Value(&local_70);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::~string((string *)&summary_val);
    uVar1 = input->count;
  }
  uVar1 = 0;
  while (uVar1 < (ulong)(((long)(input->data).
                                super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                         (long)(input->data).
                               super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                               _M_impl.super__Vector_impl_data._M_start) / 0x68)) {
    this = vector<duckdb::Vector,_true>::get<true>(&output->data,uVar1 + 1);
    other = vector<duckdb::Vector,_true>::get<true>(&input->data,uVar1);
    Vector::Reference(this,other);
    uVar1 = uVar1 + 1;
  }
  return NEED_MORE_INPUT;
}

Assistant:

static OperatorResultType SummaryFunction(ExecutionContext &context, TableFunctionInput &data_p, DataChunk &input,
                                          DataChunk &output) {
	output.SetCardinality(input.size());

	for (idx_t row_idx = 0; row_idx < input.size(); row_idx++) {
		string summary_val = "[";

		for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
			summary_val += input.GetValue(col_idx, row_idx).ToString();
			if (col_idx < input.ColumnCount() - 1) {
				summary_val += ", ";
			}
		}
		summary_val += "]";
		output.SetValue(0, row_idx, Value(summary_val));
	}
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		output.data[col_idx + 1].Reference(input.data[col_idx]);
	}
	return OperatorResultType::NEED_MORE_INPUT;
}